

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

QSize __thiscall QSlider::minimumSizeHint(QSlider *this)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  QStyle *pQVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  QStyleOptionSlider *pQVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QStyleOptionSlider opt;
  
  bVar12 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  uVar5 = (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x70))();
  uVar11 = uVar5 >> 0x20;
  puVar9 = &DAT_00661f50;
  pQVar10 = &opt;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar1 = *puVar9;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
    pQVar10 = (QStyleOptionSlider *)((long)pQVar10 + (ulong)bVar12 * -0x10 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&opt);
  pQVar6 = QWidget::style((QWidget *)this);
  uVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0xd,&opt,this);
  uVar8 = (ulong)uVar4;
  if (*(int *)(lVar3 + 0x280) != 1) {
    uVar11 = (ulong)uVar4;
    uVar8 = uVar5 & 0xffffffff;
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QSize)(uVar8 | uVar11 << 0x20);
}

Assistant:

QSize QSlider::minimumSizeHint() const
{
    Q_D(const QSlider);
    QSize s = sizeHint();
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    int length = style()->pixelMetric(QStyle::PM_SliderLength, &opt, this);
    if (d->orientation == Qt::Horizontal)
        s.setWidth(length);
    else
        s.setHeight(length);
    return s;
}